

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_double(secp256k1_gej *r,secp256k1_gej *a)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  secp256k1_gej *psVar12;
  secp256k1_gej *a_00;
  secp256k1_ge *a_01;
  secp256k1_ge *a_02;
  secp256k1_ge *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_gej *a_03;
  secp256k1_ge *psVar15;
  secp256k1_ge *r_00;
  secp256k1_ge *a_04;
  secp256k1_fe *psVar16;
  undefined1 auVar17 [16];
  secp256k1_fe s;
  secp256k1_fe l;
  undefined1 auStack_168 [56];
  uint64_t uStack_130;
  uint64_t uStack_128;
  uint64_t uStack_120;
  uint64_t uStack_118;
  undefined8 uStack_110;
  int iStack_10c;
  secp256k1_gej *psStack_108;
  secp256k1_ge *psStack_100;
  code *pcStack_f8;
  secp256k1_gej *psStack_e8;
  secp256k1_gej *psStack_e0;
  secp256k1_gej *psStack_d8;
  secp256k1_gej *psStack_c8;
  secp256k1_fe local_b8;
  undefined1 local_88 [56];
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  int local_30;
  int local_2c;
  
  a_00 = (secp256k1_gej *)&local_b8;
  a_03 = (secp256k1_gej *)&local_b8;
  psVar16 = &local_b8;
  secp256k1_gej_verify(a);
  r->infinity = a->infinity;
  secp256k1_fe_mul(&r->z,&a->z,&a->y);
  secp256k1_fe_sqr(&local_b8,&a->y);
  psVar14 = (secp256k1_gej *)(local_88 + 0x30);
  psVar12 = a;
  secp256k1_fe_sqr((secp256k1_fe *)psVar14,&a->x);
  secp256k1_fe_verify((secp256k1_fe *)psVar14);
  if (local_30 < 0xb) {
    local_30 = local_30 * 3;
    psVar12 = (secp256k1_gej *)(local_88 + 0x30);
    local_88._48_8_ = local_88._48_8_ * 3;
    local_50 = local_50 * 3;
    local_48 = local_48 * 3;
    local_40 = local_40 * 3;
    local_38 = local_38 * 3;
    local_2c = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    secp256k1_fe_half((secp256k1_fe *)psVar12);
    secp256k1_fe_verify(&local_b8);
    secp256k1_fe_verify_magnitude(&local_b8,1);
    local_88._0_8_ = 0x3ffffbfffff0bc - local_b8.n[0];
    local_88._8_8_ = 0x3ffffffffffffc - local_b8.n[1];
    psVar14 = (secp256k1_gej *)local_88;
    local_88._16_8_ = 0x3ffffffffffffc - local_b8.n[2];
    local_88._24_8_ = 0x3ffffffffffffc - local_b8.n[3];
    local_88._32_8_ = 0x3fffffffffffc - local_b8.n[4];
    local_88._40_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)psVar14,&a->x);
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar12);
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    iVar5 = local_88._40_4_ + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_00116c13;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    a = (secp256k1_gej *)local_88;
    (r->x).n[0] = (r->x).n[0] + local_88._0_8_;
    (r->x).n[1] = uVar2 + local_88._8_8_;
    (r->x).n[2] = uVar3 + local_88._16_8_;
    (r->x).n[3] = uVar4 + local_88._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_88._32_8_;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_verify(&r->x);
    psVar14 = a;
    secp256k1_fe_verify((secp256k1_fe *)a);
    iVar5 = local_88._40_4_ + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_00116c18;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    a = (secp256k1_gej *)local_88;
    (r->x).n[0] = (r->x).n[0] + local_88._0_8_;
    (r->x).n[1] = uVar2 + local_88._8_8_;
    (r->x).n[2] = uVar3 + local_88._16_8_;
    (r->x).n[3] = uVar4 + local_88._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_88._32_8_;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    secp256k1_fe_verify(&r->x);
    secp256k1_fe_sqr(&local_b8,&local_b8);
    secp256k1_fe_verify((secp256k1_fe *)a);
    psVar14 = r;
    secp256k1_fe_verify(&r->x);
    uVar6 = (r->x).magnitude + local_88._40_4_;
    if (0x20 < (int)uVar6) goto LAB_00116c1d;
    a_00 = (secp256k1_gej *)local_88;
    local_88._0_8_ = (r->x).n[0] + local_88._0_8_;
    local_88._8_8_ = (r->x).n[1] + local_88._8_8_;
    local_88._16_8_ = (r->x).n[2] + local_88._16_8_;
    local_88._24_8_ = (r->x).n[3] + local_88._24_8_;
    local_88._32_8_ = local_88._32_8_ + (r->x).n[4];
    local_88._44_4_ = 0;
    local_88._40_4_ = uVar6;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    a = (secp256k1_gej *)&r->y;
    secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a_00,(secp256k1_fe *)(local_88 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)a);
    secp256k1_fe_verify(&local_b8);
    local_b8.magnitude = local_b8.magnitude + (r->y).magnitude;
    if (local_b8.magnitude < 0x21) {
      uVar2 = (r->y).n[1];
      uVar3 = (r->y).n[2];
      uVar4 = (r->y).n[3];
      (r->y).n[0] = (r->y).n[0] + local_b8.n[0];
      (r->y).n[1] = uVar2 + local_b8.n[1];
      (r->y).n[2] = uVar3 + local_b8.n[2];
      (r->y).n[3] = uVar4 + local_b8.n[3];
      puVar1 = (r->y).n + 4;
      *puVar1 = *puVar1 + local_b8.n[4];
      (r->y).magnitude = local_b8.magnitude;
      (r->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)a);
      secp256k1_fe_verify((secp256k1_fe *)a);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)a,2);
      uVar2 = (r->y).n[1];
      uVar3 = (r->y).n[2];
      uVar4 = (r->y).n[3];
      (r->y).n[0] = 0x5ffff9ffffe91a - (r->y).n[0];
      (r->y).n[1] = 0x5ffffffffffffa - uVar2;
      (r->y).n[2] = 0x5ffffffffffffa - uVar3;
      (r->y).n[3] = 0x5ffffffffffffa - uVar4;
      (r->y).n[4] = 0x5fffffffffffa - (r->y).n[4];
      (r->y).magnitude = 3;
      (r->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)a);
      secp256k1_gej_verify(r);
      return;
    }
  }
  else {
    secp256k1_gej_double_cold_5();
LAB_00116c13:
    secp256k1_gej_double_cold_4();
LAB_00116c18:
    a_00 = psVar12;
    secp256k1_gej_double_cold_3();
LAB_00116c1d:
    a_03 = psVar14;
    psVar16 = (secp256k1_fe *)(local_88 + 0x30);
    secp256k1_gej_double_cold_2();
  }
  secp256k1_gej_double_cold_1();
  psStack_d8 = (secp256k1_gej *)0x116c34;
  psVar12 = a_03;
  psStack_c8 = r;
  secp256k1_fe_verify(&a_03->x);
  iVar5 = (a_03->x).magnitude * (int)a_00;
  if (iVar5 < 0x21) {
    uVar7 = (ulong)a_00 & 0xffffffff;
    (a_03->x).n[0] = (a_03->x).n[0] * uVar7;
    (a_03->x).n[1] = (a_03->x).n[1] * uVar7;
    (a_03->x).n[2] = (a_03->x).n[2] * uVar7;
    (a_03->x).n[3] = (a_03->x).n[3] * uVar7;
    (a_03->x).n[4] = uVar7 * (a_03->x).n[4];
    (a_03->x).magnitude = iVar5;
    (a_03->x).normalized = 0;
    secp256k1_fe_verify(&a_03->x);
    return;
  }
  psStack_d8 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  psStack_e0 = (secp256k1_gej *)0x116c9e;
  psStack_d8 = a_03;
  secp256k1_fe_verify(&psVar12->x);
  psStack_e0 = (secp256k1_gej *)0x116cab;
  psVar14 = psVar12;
  secp256k1_fe_verify_magnitude(&psVar12->x,0x1f);
  a_01 = (secp256k1_ge *)(psVar12->x).n[0];
  uVar7 = -(ulong)((uint)a_01 & 1);
  uVar9 = uVar7 >> 0xc;
  uVar11 = (long)(a_01->x).n + (uVar9 & 0xffffefffffc2f);
  if ((uVar11 & 1) == 0) {
    uVar8 = (uVar7 >> 0x10) + (psVar12->x).n[4];
    uVar10 = uVar9 + (psVar12->x).n[3];
    uVar6 = (uint)(uVar7 >> 0x2c);
    auVar17._0_8_ = CONCAT44(uVar6,(int)uVar9);
    auVar17._8_4_ = (int)uVar9;
    auVar17._12_4_ = uVar6;
    uVar7 = auVar17._0_8_ + (psVar12->x).n[1];
    uVar9 = auVar17._8_8_ + (psVar12->x).n[2];
    (psVar12->x).n[0] = ((ulong)((uint)uVar7 & 1) << 0x33) + (uVar11 >> 1);
    (psVar12->x).n[1] = ((uVar9 & 1) << 0x33) + (uVar7 >> 1);
    (psVar12->x).n[2] = ((uVar10 & 1) << 0x33) + (uVar9 >> 1);
    (psVar12->x).n[3] = ((ulong)((uint)uVar8 & 1) << 0x33) + (uVar10 >> 1);
    (psVar12->x).n[4] = uVar8 >> 1;
    (psVar12->x).magnitude = ((psVar12->x).magnitude >> 1) + 1;
    (psVar12->x).normalized = 0;
    secp256k1_fe_verify(&psVar12->x);
    return;
  }
  psStack_e0 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_half_cold_1();
  pcStack_f8 = (code *)0x116d7b;
  a_02 = a_01;
  psStack_e8 = psVar12;
  psStack_e0 = a;
  secp256k1_fe_verify(&psVar14->x);
  pcStack_f8 = (code *)0x116d83;
  psVar15 = a_01;
  secp256k1_fe_verify(&a_01->x);
  iVar5 = (a_01->x).magnitude + (psVar14->x).magnitude;
  if (iVar5 < 0x21) {
    (psVar14->x).n[0] = (psVar14->x).n[0] + (a_01->x).n[0];
    puVar1 = (psVar14->x).n + 1;
    *puVar1 = *puVar1 + (a_01->x).n[1];
    puVar1 = (psVar14->x).n + 2;
    *puVar1 = *puVar1 + (a_01->x).n[2];
    puVar1 = (psVar14->x).n + 3;
    *puVar1 = *puVar1 + (a_01->x).n[3];
    puVar1 = (psVar14->x).n + 4;
    *puVar1 = *puVar1 + (a_01->x).n[4];
    (psVar14->x).magnitude = iVar5;
    (psVar14->x).normalized = 0;
    secp256k1_fe_verify(&psVar14->x);
    return;
  }
  pcStack_f8 = secp256k1_ge_to_storage;
  secp256k1_fe_add_cold_1();
  a_04 = (secp256k1_ge *)auStack_168;
  psVar13 = a_02;
  r_00 = a_02;
  psStack_108 = psVar14;
  psStack_100 = a_01;
  pcStack_f8 = (code *)psVar16;
  secp256k1_ge_verify(a_02);
  if (a_02->infinity == 0) {
    auStack_168._48_8_ = (a_02->x).n[0];
    uStack_130 = (a_02->x).n[1];
    uStack_128 = (a_02->x).n[2];
    uStack_120 = (a_02->x).n[3];
    uStack_118 = (a_02->x).n[4];
    uStack_110._0_4_ = (a_02->x).magnitude;
    iStack_10c = (a_02->x).normalized;
    r_00 = (secp256k1_ge *)(auStack_168 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)r_00);
    auStack_168._0_8_ = (a_02->y).n[0];
    auStack_168._8_8_ = (a_02->y).n[1];
    auStack_168._16_8_ = (a_02->y).n[2];
    auStack_168._24_8_ = (a_02->y).n[3];
    auStack_168._32_8_ = (a_02->y).n[4];
    auStack_168._40_4_ = (a_02->y).magnitude;
    auStack_168._44_4_ = (a_02->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_168);
    secp256k1_fe_verify((secp256k1_fe *)r_00);
    if (iStack_10c != 0) {
      (psVar15->x).n[0] = uStack_130 << 0x34 | auStack_168._48_8_;
      (psVar15->x).n[1] = uStack_128 << 0x28 | uStack_130 >> 0xc;
      (psVar15->x).n[2] = uStack_120 << 0x1c | uStack_128 >> 0x18;
      (psVar15->x).n[3] = uStack_118 << 0x10 | uStack_120 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_168);
      if (auStack_168._44_4_ != 0) {
        (psVar15->x).n[4] = auStack_168._8_8_ << 0x34 | auStack_168._0_8_;
        uVar7 = auStack_168._16_8_ << 0x28 | (ulong)auStack_168._8_8_ >> 0xc;
        (psVar15->x).magnitude = (int)uVar7;
        (psVar15->x).normalized = (int)(uVar7 >> 0x20);
        (psVar15->y).n[0] = auStack_168._24_8_ << 0x1c | (ulong)auStack_168._16_8_ >> 0x18;
        (psVar15->y).n[1] = auStack_168._32_8_ << 0x10 | (ulong)auStack_168._24_8_ >> 0x24;
        return;
      }
      goto LAB_00116f25;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_04 = r_00;
  secp256k1_ge_to_storage_cold_3();
LAB_00116f25:
  secp256k1_ge_to_storage_cold_2();
  (a_04->x).n[0] = (psVar13->x).n[0] & 0xfffffffffffff;
  (a_04->x).n[1] = ((psVar13->x).n[1] & 0xffffffffff) << 0xc | (psVar13->x).n[0] >> 0x34;
  (a_04->x).n[2] = ((psVar13->x).n[2] & 0xfffffff) << 0x18 | (psVar13->x).n[1] >> 0x28;
  (a_04->x).n[3] = ((psVar13->x).n[3] & 0xffff) << 0x24 | (psVar13->x).n[2] >> 0x1c;
  (a_04->x).n[4] = (psVar13->x).n[3] >> 0x10;
  (a_04->x).magnitude = 1;
  (a_04->x).normalized = 1;
  secp256k1_fe_verify(&a_04->x);
  (a_04->y).n[0] = (psVar13->x).n[4] & 0xfffffffffffff;
  uVar7._0_4_ = (psVar13->x).magnitude;
  uVar7._4_4_ = (psVar13->x).normalized;
  (a_04->y).n[1] = (uVar7 & 0xffffffffff) << 0xc | (psVar13->x).n[4] >> 0x34;
  uVar9._0_4_ = (psVar13->x).magnitude;
  uVar9._4_4_ = (psVar13->x).normalized;
  (a_04->y).n[2] = ((psVar13->y).n[0] & 0xfffffff) << 0x18 | uVar9 >> 0x28;
  (a_04->y).n[3] = ((psVar13->y).n[1] & 0xffff) << 0x24 | (psVar13->y).n[0] >> 0x1c;
  (a_04->y).n[4] = (psVar13->y).n[1] >> 0x10;
  (a_04->y).magnitude = 1;
  (a_04->y).normalized = 1;
  secp256k1_fe_verify(&a_04->y);
  a_04->infinity = 0;
  secp256k1_ge_verify(a_04);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_gej_double(secp256k1_gej *r, const secp256k1_gej *a) {
    /* Operations: 3 mul, 4 sqr, 8 add/half/mul_int/negate */
    secp256k1_fe l, s, t;
    SECP256K1_GEJ_VERIFY(a);

    r->infinity = a->infinity;

    /* Formula used:
     * L = (3/2) * X1^2
     * S = Y1^2
     * T = -X1*S
     * X3 = L^2 + 2*T
     * Y3 = -(L*(X3 + T) + S^2)
     * Z3 = Y1*Z1
     */

    secp256k1_fe_mul(&r->z, &a->z, &a->y); /* Z3 = Y1*Z1 (1) */
    secp256k1_fe_sqr(&s, &a->y);           /* S = Y1^2 (1) */
    secp256k1_fe_sqr(&l, &a->x);           /* L = X1^2 (1) */
    secp256k1_fe_mul_int(&l, 3);           /* L = 3*X1^2 (3) */
    secp256k1_fe_half(&l);                 /* L = 3/2*X1^2 (2) */
    secp256k1_fe_negate(&t, &s, 1);        /* T = -S (2) */
    secp256k1_fe_mul(&t, &t, &a->x);       /* T = -X1*S (1) */
    secp256k1_fe_sqr(&r->x, &l);           /* X3 = L^2 (1) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + T (2) */
    secp256k1_fe_add(&r->x, &t);           /* X3 = L^2 + 2*T (3) */
    secp256k1_fe_sqr(&s, &s);              /* S' = S^2 (1) */
    secp256k1_fe_add(&t, &r->x);           /* T' = X3 + T (4) */
    secp256k1_fe_mul(&r->y, &t, &l);       /* Y3 = L*(X3 + T) (1) */
    secp256k1_fe_add(&r->y, &s);           /* Y3 = L*(X3 + T) + S^2 (2) */
    secp256k1_fe_negate(&r->y, &r->y, 2);  /* Y3 = -(L*(X3 + T) + S^2) (3) */

    SECP256K1_GEJ_VERIFY(r);
}